

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GetConfigsBoundsCase::GetConfigsBoundsCase
          (GetConfigsBoundsCase *this,EglTestContext *eglTestCtx,char *name,char *description)

{
  Library *egl;
  
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  egl = EglTestContext::getLibrary(eglTestCtx);
  eglu::CallLogWrapper::CallLogWrapper(&this->super_CallLogWrapper,egl,eglTestCtx->m_testCtx->m_log)
  ;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetConfigsBoundsCase_021579c0;
  this->m_display = (EGLDisplay)0x0;
  return;
}

Assistant:

GetConfigsBoundsCase (EglTestContext& eglTestCtx, const char* name, const char* description)
		: TestCase		(eglTestCtx, name, description)
		, CallLogWrapper(eglTestCtx.getLibrary(), eglTestCtx.getTestContext().getLog())
		, m_display		(EGL_NO_DISPLAY)
	{
	}